

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::AlpScanState<float>::LoadVector<true>(AlpScanState<float> *this,float *value_buffer)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long count;
  unsigned_long uVar4;
  idx_t __n;
  float *in_RSI;
  long in_RDI;
  idx_t bp_size;
  data_ptr_t vector_ptr;
  idx_t vector_size;
  uint data_byte_offset;
  idx_t in_stack_ffffffffffffffd0;
  const_data_ptr_t local_28;
  
  AlpVectorState<float>::Reset((AlpVectorState<float> *)(in_RDI + 0x38));
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -4;
  uVar3 = Load<unsigned_int>(*(const_data_ptr_t *)(in_RDI + 0x20));
  count = MinValue<unsigned_long>(0x400,*(long *)(in_RDI + 0x4860) - *(long *)(in_RDI + 0x30));
  local_28 = (const_data_ptr_t)(*(long *)(in_RDI + 0x28) + (ulong)uVar3);
  uVar1 = Load<unsigned_char>(local_28);
  *(uchar *)(in_RDI + 0x4840) = uVar1;
  uVar1 = Load<unsigned_char>(local_28 + 1);
  *(uchar *)(in_RDI + 0x4841) = uVar1;
  uVar2 = Load<unsigned_short>(local_28 + 2);
  *(unsigned_short *)(in_RDI + 0x4842) = uVar2;
  uVar4 = Load<unsigned_long>(local_28 + 4);
  *(unsigned_long *)(in_RDI + 0x4848) = uVar4;
  uVar1 = Load<unsigned_char>(local_28 + 0xc);
  *(uchar *)(in_RDI + 0x4850) = uVar1;
  local_28 = local_28 + 0xd;
  if (*(char *)(in_RDI + 0x4850) != '\0') {
    __n = BitpackingPrimitives::GetRequiredSize
                    (in_stack_ffffffffffffffd0,(bitpacking_width_t)((ulong)in_RDI >> 0x38));
    memcpy((void *)(in_RDI + 0x2840),local_28,__n);
    local_28 = local_28 + __n;
  }
  if (*(short *)(in_RDI + 0x4842) != 0) {
    memcpy((void *)(in_RDI + 0x1040),local_28,(ulong)*(ushort *)(in_RDI + 0x4842) << 2);
    memcpy((void *)(in_RDI + 0x2040),local_28 + (ulong)*(ushort *)(in_RDI + 0x4842) * 4,
           (long)(int)((uint)*(ushort *)(in_RDI + 0x4842) << 1));
  }
  AlpVectorState<float>::LoadValues<true>((AlpVectorState<float> *)(in_RDI + 0x38),in_RSI,count);
  return;
}

Assistant:

void LoadVector(T *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.v_exponent = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::EXPONENT_SIZE;

		vector_state.v_factor = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::FACTOR_SIZE;

		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpConstants::EXCEPTIONS_COUNT_SIZE;

		vector_state.frame_of_reference = Load<uint64_t>(vector_ptr);
		vector_ptr += AlpConstants::FOR_SIZE;

		vector_state.bit_width = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::BIT_WIDTH_SIZE;

		D_ASSERT(vector_state.exceptions_count <= vector_size);
		D_ASSERT(vector_state.v_exponent <= AlpTypedConstants<T>::MAX_EXPONENT);
		D_ASSERT(vector_state.v_factor <= vector_state.v_exponent);
		D_ASSERT(vector_state.bit_width <= sizeof(uint64_t) * 8);

		if (vector_state.bit_width > 0) {
			auto bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.bit_width);
			memcpy(vector_state.for_encoded, (void *)vector_ptr, bp_size);
			vector_ptr += bp_size;
		}

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr, sizeof(EXACT_TYPE) * vector_state.exceptions_count);
			vector_ptr += sizeof(EXACT_TYPE) * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}